

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_4489d7::BuildFileImpl::parseNodesMapping(BuildFileImpl *this,MappingNode *map)

{
  BuildFileDelegate *pBVar1;
  BuildFileDelegate *pBVar2;
  uint uVar3;
  KeyValueNode *pKVar4;
  StringRef message;
  StringRef name_00;
  _Alloc_hider _Var5;
  size_type sVar6;
  char cVar7;
  Node *pNVar9;
  MappingNode *C;
  SequenceNode *C_00;
  long *plVar10;
  size_t sVar11;
  ScalarNode *scalar;
  ScalarNode *scalar_00;
  ScalarNode *scalar_01;
  ScalarNode *scalar_02;
  ScalarNode *extraout_RDX;
  ScalarNode *scalar_03;
  ScalarNode *extraout_RDX_00;
  char *pcVar12;
  bool bVar13;
  StringRef message_00;
  StringRef message_01;
  StringRef message_02;
  StringRef message_03;
  iterator __begin5;
  string key;
  string value;
  iterator __begin3;
  iterator __begin2;
  string attribute;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string name;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_140;
  string local_138;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [32];
  Node *local_b8;
  Node *local_b0;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_a8;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_a0;
  string local_98;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  BuildFileImpl *local_58;
  string local_50;
  int iVar8;
  
  local_a0.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(map);
  if (local_a0.Base == (MappingNode *)0x0) {
    bVar13 = true;
  }
  else {
    pBVar2 = (BuildFileDelegate *)(local_118 + 0x10);
    local_58 = this;
    do {
      pKVar4 = (local_a0.Base)->CurrentEntry;
      if (pKVar4 == (KeyValueNode *)0x0) {
LAB_001b3136:
        pcVar12 = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
        ;
LAB_001b3162:
        __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                      ,0x151,pcVar12);
      }
      pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
      if (pNVar9->TypeID == 1) {
        pNVar9 = llvm::yaml::KeyValueNode::getValue(pKVar4);
        if (pNVar9->TypeID != 4) {
          pNVar9 = llvm::yaml::KeyValueNode::getValue(pKVar4);
          sVar11 = 0x21;
          pcVar12 = "invalid value type in \'nodes\' map";
          goto LAB_001b30a3;
        }
        pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  (&local_50,pNVar9,scalar);
        C = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar4);
        name_00.Length = local_50._M_string_length;
        name_00.Data = local_50._M_dataplus._M_p;
        local_b8 = getOrCreateNode(this,name_00,false);
        local_a8.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(C);
        while (local_a8.Base != (MappingNode *)0x0) {
          pKVar4 = (local_a8.Base)->CurrentEntry;
          if (pKVar4 == (KeyValueNode *)0x0) goto LAB_001b3136;
          pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
          C_00 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar4);
          if (pNVar9->TypeID == 1) {
            local_b0 = pNVar9;
            (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                      (&local_98,pNVar9,scalar_00);
            sVar6 = local_98._M_string_length;
            _Var5._M_p = local_98._M_dataplus._M_p;
            uVar3 = (C_00->super_Node).TypeID;
            if (uVar3 == 1) {
              local_108._8_8_ = (local_b0->SourceRange).Start.Ptr;
              local_118._0_8_ = this->delegate;
              local_118._8_8_ = (this->mainFilename)._M_dataplus._M_p;
              local_108._M_allocated_capacity = (this->mainFilename)._M_string_length;
              local_f8._M_p._0_4_ = *(int *)&(local_b0->SourceRange).End.Ptr - (int)local_108._8_8_;
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        (&local_138,C_00,(ScalarNode *)local_108._M_allocated_capacity);
              iVar8 = (*local_b8->_vptr_Node[2])
                                (local_b8,local_118,_Var5._M_p,sVar6,local_138._M_dataplus._M_p,
                                 local_138._M_string_length);
              cVar7 = (char)iVar8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
LAB_001b300c:
              iVar8 = 1;
              if (cVar7 != '\0') {
                iVar8 = 0;
              }
            }
            else {
              if (uVar3 == 5) {
                local_138._M_dataplus._M_p = (pointer)0x0;
                local_138._M_string_length = 0;
                local_138.field_2._M_allocated_capacity = 0;
                local_d8._0_8_ = llvm::yaml::begin<llvm::yaml::SequenceNode>(C_00);
                scalar_03 = extraout_RDX;
                while (sVar6 = local_98._M_string_length, _Var5._M_p = local_98._M_dataplus._M_p,
                      (SequenceNode *)local_d8._0_8_ != (SequenceNode *)0x0) {
                  pNVar9 = *(Node **)(local_d8._0_8_ + 0x50);
                  if (pNVar9 == (Node *)0x0) {
                    pcVar12 = 
                    "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
                    ;
                    goto LAB_001b3162;
                  }
                  if (pNVar9->TypeID == 1) {
                    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                              ((string *)local_118,pNVar9,scalar_03);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_138,(string *)local_118);
                    if ((BuildFileDelegate *)local_118._0_8_ != pBVar2) {
                      operator_delete((void *)local_118._0_8_,
                                      (ulong)(local_108._M_allocated_capacity + 1));
                    }
                  }
                  else {
                    message_01.Length = 0x2a;
                    message_01.Data = "invalid value type for node in \'nodes\' map";
                    error(this,pNVar9,message_01);
                  }
                  llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                  ::operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                *)local_d8);
                  scalar_03 = extraout_RDX_00;
                }
                local_108._8_8_ = (local_b0->SourceRange).Start.Ptr;
                local_118._0_8_ = this->delegate;
                local_118._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                local_108._M_allocated_capacity = (this->mainFilename)._M_string_length;
                local_f8._M_p._0_4_ =
                     *(int *)&(local_b0->SourceRange).End.Ptr - (int)local_108._8_8_;
                local_d8._0_8_ = (SequenceNode *)0x0;
                local_d8._8_8_ = 0;
                local_d8._16_8_ = 0;
                std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)local_d8,
                           local_138._M_dataplus._M_p,local_138._M_string_length);
                iVar8 = (*local_b8->_vptr_Node[3])
                                  (local_b8,local_118,_Var5._M_p,sVar6,local_d8._0_8_,
                                   (long)(local_d8._8_8_ - local_d8._0_8_) >> 4);
                cVar7 = (char)iVar8;
                if ((SequenceNode *)local_d8._0_8_ != (SequenceNode *)0x0) {
                  operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_138);
                goto LAB_001b300c;
              }
              if (uVar3 == 4) {
                local_78.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_78.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_78.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_140.Base =
                     (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)C_00);
                while (sVar6 = local_98._M_string_length, _Var5._M_p = local_98._M_dataplus._M_p,
                      local_140.Base != (MappingNode *)0x0) {
                  pKVar4 = (local_140.Base)->CurrentEntry;
                  if (pKVar4 == (KeyValueNode *)0x0) goto LAB_001b3136;
                  pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
                  if (pNVar9->TypeID == 1) {
                    pNVar9 = llvm::yaml::KeyValueNode::getValue(pKVar4);
                    if (pNVar9->TypeID != 1) {
                      pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
                      pcVar12 = "invalid value type for \'";
                      goto LAB_001b2c73;
                    }
                    pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
                    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                              (&local_138,pNVar9,scalar_01);
                    pNVar9 = llvm::yaml::KeyValueNode::getValue(pKVar4);
                    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                              ((string *)local_d8,pNVar9,scalar_02);
                    local_118._0_8_ = pBVar2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_118,local_138._M_dataplus._M_p,
                               local_138._M_dataplus._M_p + local_138._M_string_length);
                    local_f8._M_p = (pointer)&local_e8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_f8,local_d8._0_8_,
                               (long)&((Node *)local_d8._0_8_)->_vptr_Node + local_d8._8_8_);
                    std::
                    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                *)&local_78,
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_118);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_p != &local_e8) {
                      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
                    }
                    if ((BuildFileDelegate *)local_118._0_8_ != pBVar2) {
                      operator_delete((void *)local_118._0_8_,
                                      (ulong)(local_108._M_allocated_capacity + 1));
                    }
                    if ((SequenceNode *)local_d8._0_8_ != (SequenceNode *)(local_d8 + 0x10)) {
                      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
                    }
                    this = local_58;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                      this = local_58;
                    }
                  }
                  else {
                    pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
                    pcVar12 = "invalid key type for \'";
LAB_001b2c73:
                    std::operator+(&local_138,pcVar12,&local_98);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_138);
                    pBVar1 = (BuildFileDelegate *)(plVar10 + 2);
                    if ((BuildFileDelegate *)*plVar10 == pBVar1) {
                      local_108._M_allocated_capacity = (size_type)pBVar1->_vptr_BuildFileDelegate;
                      local_108._8_8_ = plVar10[3];
                      local_118._0_8_ = pBVar2;
                    }
                    else {
                      local_108._M_allocated_capacity = (size_type)pBVar1->_vptr_BuildFileDelegate;
                      local_118._0_8_ = (BuildFileDelegate *)*plVar10;
                    }
                    local_118._8_8_ = plVar10[1];
                    *plVar10 = (long)pBVar1;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    message.Length = local_118._8_8_;
                    message.Data = (char *)local_118._0_8_;
                    error(this,pNVar9,message);
                    if ((BuildFileDelegate *)local_118._0_8_ != pBVar2) {
                      operator_delete((void *)local_118._0_8_,
                                      (ulong)(local_108._M_allocated_capacity + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                  }
                  llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator++(&local_140);
                }
                local_108._8_8_ = (local_b0->SourceRange).Start.Ptr;
                local_118._0_8_ = this->delegate;
                local_118._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                local_108._M_allocated_capacity = (this->mainFilename)._M_string_length;
                local_f8._M_p._0_4_ =
                     *(int *)&(local_b0->SourceRange).End.Ptr - (int)local_108._8_8_;
                local_138._M_dataplus._M_p = (pointer)0x0;
                local_138._M_string_length = 0;
                local_138.field_2._M_allocated_capacity = 0;
                std::
                vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                ::
                _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                          ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                            *)&local_138,
                           local_78.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_78.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                iVar8 = (*local_b8->_vptr_Node[4])
                                  (local_b8,local_118,_Var5._M_p,sVar6,local_138._M_dataplus._M_p,
                                   (long)(local_138._M_string_length -
                                         (long)local_138._M_dataplus._M_p) >> 5);
                cVar7 = (char)iVar8;
                if (local_138._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity -
                                  (long)local_138._M_dataplus._M_p);
                }
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector(&local_78);
                goto LAB_001b300c;
              }
              message_02.Length = 0x2a;
              message_02.Data = "invalid value type for node in \'nodes\' map";
              error(this,(Node *)C_00,message_02);
              iVar8 = 5;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            message_00.Length = 0x28;
            message_00.Data = "invalid key type for node in \'nodes\' map";
            error(this,pNVar9,message_00);
            iVar8 = 5;
          }
          if ((iVar8 != 5) && (iVar8 != 0)) goto LAB_001b30df;
          llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
          operator++(&local_a8);
        }
        iVar8 = 4;
LAB_001b30df:
        if (iVar8 == 4) {
          iVar8 = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar4);
        sVar11 = 0x1f;
        pcVar12 = "invalid key type in \'nodes\' map";
LAB_001b30a3:
        message_03.Length = sVar11;
        message_03.Data = pcVar12;
        error(this,pNVar9,message_03);
        iVar8 = 3;
      }
      if ((iVar8 != 3) && (iVar8 != 0)) goto LAB_001b3119;
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&local_a0);
    } while (local_a0.Base != (MappingNode *)0x0);
    iVar8 = 2;
LAB_001b3119:
    bVar13 = iVar8 == 2;
  }
  return bVar13;
}

Assistant:

bool parseNodesMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'nodes' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'nodes' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Get the node.
      //
      // FIXME: One downside of doing the lookup here is that the client cannot
      // ever make a context dependent node that can have configured properties.
      auto node = getOrCreateNode(name, /*isImplicit=*/false);

      // Configure all of the tool attributes.
      for (auto& valueEntry: *attrs) {
        auto key = valueEntry.getKey();
        auto value = valueEntry.getValue();
        
        // All keys must be scalar.
        if (key->getType() != llvm::yaml::Node::NK_Scalar) {
          error(key, "invalid key type for node in 'nodes' map");
          continue;
        }

        auto attribute = stringFromScalarNode(
            static_cast<llvm::yaml::ScalarNode*>(key));

        if (value->getType() == llvm::yaml::Node::NK_Mapping) {
          std::vector<std::pair<std::string, std::string>> values;
          for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
            // Every key must be scalar.
            if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid key type for '" + attribute +
                                     "' in 'nodes' map"));
              continue;
            }
            // Every value must be scalar.
            if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid value type for '" + attribute +
                                     "' in 'nodes' map"));
              continue;
            }

            std::string key = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
            std::string value = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
            values.push_back(std::make_pair(key, value));
          }

          if (!node->configureAttribute(
                  getContext(key), attribute,
                  std::vector<std::pair<StringRef, StringRef>>(
                      values.begin(), values.end()))) {
            return false;
          }
        } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
          std::vector<std::string> values;
          for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
            if (node.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&node, "invalid value type for node in 'nodes' map");
              continue;
            }
            values.push_back(
                stringFromScalarNode(
                    static_cast<llvm::yaml::ScalarNode*>(&node)));
          }

          if (!node->configureAttribute(
                  getContext(key), attribute,
                  std::vector<StringRef>(values.begin(), values.end()))) {
            return false;
          }
        } else {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for node in 'nodes' map");
            continue;
          }
        
          if (!node->configureAttribute(
                  getContext(key), attribute,
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(value)))) {
            return false;
          }
        }
      }
    }

    return true;
  }